

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  abctime aVar3;
  int *__ptr;
  abctime aVar4;
  char *pcVar5;
  int *pSimInfo;
  abctime clk;
  uint local_50;
  int fVerbose;
  int fSynthesize;
  int fAlignPol;
  int nConfTotal;
  int nConfPart;
  int nPartSize;
  int nAlgo;
  int c;
  int RetValue;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nConfPart = 0;
  nConfTotal = 10000;
  fSynthesize = 1000000;
  fVerbose = 1;
  local_50 = 0;
  clk._4_4_ = 1;
  Extra_UtilGetoptReset();
LAB_00292d2b:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"APCpsvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkLatchNum(pNtk_00);
      if (0 < iVar1) {
        Abc_Print(-1,"Currently can only solve the miter for combinational circuits.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      aVar3 = Abc_Clock();
      iVar1 = Abc_NtkPartitionedSat
                        (pNtk_00,nConfPart,nConfTotal,0,fSynthesize,fVerbose,local_50,clk._4_4_);
      if ((iVar1 == 0) && (iVar2 = Abc_NtkPoNum(pNtk_00), iVar2 == 1)) {
        __ptr = Abc_NtkVerifySimulatePattern(pNtk_00,pNtk_00->pModel);
        if (*__ptr != 1) {
          Abc_Print(1,"ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n");
        }
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
      }
      if (iVar1 == -1) {
        Abc_Print(1,"UNDECIDED      ");
      }
      else if (iVar1 == 0) {
        Abc_Print(1,"SATISFIABLE    ");
      }
      else {
        Abc_Print(1,"UNSATISFIABLE  ");
      }
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - aVar3);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_0029305c;
      }
      nConfPart = atoi(argv[globalUtilOptind]);
      iVar1 = nConfPart;
      break;
    default:
      goto LAB_0029305c;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0029305c;
      }
      fSynthesize = atoi(argv[globalUtilOptind]);
      iVar1 = fSynthesize;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_0029305c;
      }
      nConfTotal = atoi(argv[globalUtilOptind]);
      iVar1 = nConfTotal;
      break;
    case 0x68:
      goto LAB_0029305c;
    case 0x70:
      fVerbose = fVerbose ^ 1;
      goto LAB_00292d2b;
    case 0x73:
      local_50 = local_50 ^ 1;
      goto LAB_00292d2b;
    case 0x76:
      clk._4_4_ = clk._4_4_ ^ 1;
      goto LAB_00292d2b;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0029305c:
      Abc_Print(-2,"usage: psat [-APC num] [-psvh]\n");
      Abc_Print(-2,"\t         solves the combinational miter using partitioning\n");
      Abc_Print(-2,"\t         (derives CNF from the current network and leave it unchanged)\n");
      Abc_Print(-2,
                "\t         for multi-output miters, tries to prove that the AND of POs is always 0\n"
               );
      Abc_Print(-2,"\t         (if POs should be ORed instead of ANDed, use command \"orpos\")\n");
      Abc_Print(-2,"\t-A num : partitioning algorithm [default = %d]\n",(ulong)(uint)nConfPart);
      Abc_Print(-2,"\t         0 : no partitioning\n");
      Abc_Print(-2,"\t         1 : partitioning by level\n");
      Abc_Print(-2,"\t         2 : DFS post-order\n");
      Abc_Print(-2,"\t         3 : DFS pre-order\n");
      Abc_Print(-2,"\t         4 : bit-slicing\n");
      Abc_Print(-2,"\t         partitions are ordered by level (high level first)\n");
      Abc_Print(-2,"\t-P num : limit on the partition size [default = %d]\n",(ulong)(uint)nConfTotal
               );
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",
                (ulong)(uint)fSynthesize);
      pcVar5 = "no";
      if (fVerbose != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-p     : align polarity of SAT variables [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (local_50 != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-s     : apply logic synthesis to each partition [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (clk._4_4_ != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int RetValue;
    int c;
    int nAlgo;
    int nPartSize;
    int nConfPart;
    int nConfTotal;
    int fAlignPol;
    int fSynthesize;
    int fVerbose;
    abctime clk;

    extern int Abc_NtkPartitionedSat( Abc_Ntk_t * pNtk, int nAlgo, int nPartSize, int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose );
    // set defaults
    nAlgo       =        0;
    nPartSize   =    10000;
    nConfPart   =        0;
    nConfTotal  =  1000000;
    fAlignPol   =        1;
    fSynthesize =        0;
    fVerbose    =        1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "APCpsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            nAlgo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nAlgo < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPartSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfTotal = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfTotal < 0 )
                goto usage;
            break;
        case 'p':
            fAlignPol ^= 1;
            break;
        case 's':
            fSynthesize ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    clk = Abc_Clock();
    RetValue = Abc_NtkPartitionedSat( pNtk, nAlgo, nPartSize, nConfPart, nConfTotal, fAlignPol, fSynthesize, fVerbose );
    // verify that the pattern is correct
    if ( RetValue == 0 && Abc_NtkPoNum(pNtk) == 1 )
    {
        //int i;
        //Abc_Obj_t * pObj;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtk->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n" );
        ABC_FREE( pSimInfo );
        /*
        // print model
        Abc_NtkForEachPi( pNtk, pObj, i )
        {
            Abc_Print( -1, "%d", (int)(pNtk->pModel[i] > 0) );
            if ( i == 70 )
                break;
        }
        Abc_Print( -1, "\n" );
        */
    }

    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;

usage:
    Abc_Print( -2, "usage: psat [-APC num] [-psvh]\n" );
    Abc_Print( -2, "\t         solves the combinational miter using partitioning\n" );
    Abc_Print( -2, "\t         (derives CNF from the current network and leave it unchanged)\n" );
    Abc_Print( -2, "\t         for multi-output miters, tries to prove that the AND of POs is always 0\n" );
    Abc_Print( -2, "\t         (if POs should be ORed instead of ANDed, use command \"orpos\")\n" );
    Abc_Print( -2, "\t-A num : partitioning algorithm [default = %d]\n", nAlgo );
    Abc_Print( -2, "\t         0 : no partitioning\n" );
    Abc_Print( -2, "\t         1 : partitioning by level\n" );
    Abc_Print( -2, "\t         2 : DFS post-order\n" );
    Abc_Print( -2, "\t         3 : DFS pre-order\n" );
    Abc_Print( -2, "\t         4 : bit-slicing\n" );
    Abc_Print( -2, "\t         partitions are ordered by level (high level first)\n" );
    Abc_Print( -2, "\t-P num : limit on the partition size [default = %d]\n", nPartSize );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", nConfTotal );
    Abc_Print( -2, "\t-p     : align polarity of SAT variables [default = %s]\n", fAlignPol? "yes": "no" );
    Abc_Print( -2, "\t-s     : apply logic synthesis to each partition [default = %s]\n", fSynthesize? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}